

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O2

bool __thiscall USDFParser::ParseChoice(USDFParser *this,FStrifeDialogueReply ***replyptr)

{
  FStrifeDialogueReply **ppFVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  FStrifeDialogueReply *pFVar6;
  size_t sVar7;
  PClassActor *pPVar8;
  char *pcVar9;
  FString *this_00;
  bool block;
  FName key;
  FString LogString;
  FString QuickNo;
  FString QuickYes;
  FString ReplyString;
  
  pFVar6 = (FStrifeDialogueReply *)operator_new(0x88);
  pFVar6->GiveType = (PClassActor *)0x0;
  pFVar6->ActionSpecial = 0;
  pFVar6->Args[0] = 0;
  pFVar6->Args[1] = 0;
  pFVar6->Args[2] = 0;
  pFVar6->Args[3] = 0;
  pFVar6->Args[4] = 0;
  (pFVar6->ItemCheck).Array = (FStrifeDialogueItemCheck *)0x0;
  (pFVar6->ItemCheck).Most = 0;
  (pFVar6->ItemCheck).Count = 0;
  (pFVar6->ItemCheckRequire).Array = (FStrifeDialogueItemCheck *)0x0;
  (pFVar6->ItemCheckRequire).Most = 0;
  (pFVar6->ItemCheckRequire).Count = 0;
  (pFVar6->ItemCheckExclude).Array = (FStrifeDialogueItemCheck *)0x0;
  (pFVar6->ItemCheckExclude).Most = 0;
  (pFVar6->ItemCheckExclude).Count = 0;
  pFVar6->Reply = (char *)0x0;
  pFVar6->QuickYes = (char *)0x0;
  pFVar6->NextNode = 0;
  pFVar6->LogNumber = 0;
  pFVar6->LogString = (char *)0x0;
  pFVar6->QuickNo = (char *)0x0;
  *(undefined8 *)&pFVar6->NeedsGold = 0;
  ppFVar1 = *replyptr;
  pFVar6->Next = *ppFVar1;
  *ppFVar1 = pFVar6;
  *replyptr = (FStrifeDialogueReply **)pFVar6;
  ReplyString.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 4;
  QuickYes.Chars = FString::NullString.Nothing;
  QuickNo.Chars = FString::NullString.Nothing;
  LogString.Chars = FString::NullString.Nothing;
  pFVar6->NeedsGold = false;
  bVar3 = false;
LAB_00460fca:
  bVar2 = FScanner::CheckToken((FScanner *)this,0x7d);
  if (bVar2) {
    if (((pFVar6->ItemCheck).Count != 0) && (((pFVar6->ItemCheck).Array)->Amount < 1)) {
      pFVar6->NeedsGold = false;
    }
    pcVar9 = ncopystring(ReplyString.Chars);
    pFVar6->Reply = pcVar9;
    pcVar9 = ncopystring(QuickYes.Chars);
    pFVar6->QuickYes = pcVar9;
    if (((pFVar6->ItemCheck).Count == 0) ||
       (((pFVar6->ItemCheck).Array)->Item == (PClassInventory *)0x0)) {
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = ncopystring(QuickNo.Chars);
    }
    pFVar6->QuickNo = pcVar9;
    pcVar9 = ncopystring(LogString.Chars);
    pFVar6->LogString = pcVar9;
    if (bVar3 == false) {
      pFVar6->NextNode = -pFVar6->NextNode;
    }
    FString::~FString(&LogString);
    FString::~FString(&QuickNo);
    FString::~FString(&QuickYes);
    FString::~FString(&ReplyString);
    return true;
  }
  UDMFParserBase::ParseKey((UDMFParserBase *)&key,SUB81(this,0),(bool *)0x1);
  switch(key.Index) {
  case 0x1df:
    pcVar9 = UDMFParserBase::CheckString
                       (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1df].Text);
    this_00 = &ReplyString;
    break;
  case 0x1e0:
    bVar2 = UDMFParserBase::CheckBool
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1e0].Text);
    pFVar6->NeedsGold = bVar2;
    goto LAB_00460fca;
  case 0x1e1:
    pcVar9 = UDMFParserBase::CheckString
                       (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1e1].Text);
    this_00 = &QuickYes;
    break;
  case 0x1e2:
    pcVar9 = UDMFParserBase::CheckString
                       (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1e2].Text);
    this_00 = &QuickNo;
    break;
  case 0x1e3:
    if ((this->super_UDMFParserBase).namespace_bits == 2) {
      pcVar9 = UDMFParserBase::CheckString
                         (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1e3].Text);
      sVar7 = strlen(pcVar9);
      if ((sVar7 < 4) || (iVar4 = strncasecmp(pcVar9,"LOG",3), iVar4 != 0)) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Log must be in the format of LOG# to compile, ignoring.");
      }
      else {
        iVar4 = atoi(pcVar9 + 3);
        pFVar6->LogNumber = iVar4;
      }
      goto LAB_00460fca;
    }
    pcVar9 = UDMFParserBase::CheckString
                       (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1e3].Text);
    this_00 = &LogString;
    break;
  case 0x1e4:
    pPVar8 = CheckActorType(this,FName::NameData.NameArray[0x1e4].Text);
    pFVar6->GiveType = pPVar8;
    goto LAB_00460fca;
  case 0x1e5:
    iVar4 = UDMFParserBase::CheckInt
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1e5].Text);
    pFVar6->NextNode = iVar4;
    goto LAB_00460fca;
  case 0x1e6:
    bVar3 = UDMFParserBase::CheckBool
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1e6].Text);
    goto LAB_00460fca;
  default:
    goto switchD_00461059_default;
  }
  FString::operator=(this_00,pcVar9);
  goto LAB_00460fca;
switchD_00461059_default:
  if (key.Index - 0x118U < 5) {
    iVar4 = UDMFParserBase::CheckInt
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[(uint)key.Index].Text);
    *(int *)((long)pFVar6 + (long)key.Index * 4 + -0x44c) = iVar4;
  }
  else if (key.Index == 0xed) {
    uVar5 = UDMFParserBase::CheckInt
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0xed].Text);
    if (0xff < uVar5) {
      uVar5 = 0;
    }
    pFVar6->ActionSpecial = uVar5;
  }
  goto LAB_00460fca;
}

Assistant:

bool ParseChoice(FStrifeDialogueReply **&replyptr)
	{
		FStrifeDialogueReply *reply = new FStrifeDialogueReply;
		memset(reply, 0, sizeof(*reply));

		reply->Next = *replyptr;
		*replyptr = reply;
		replyptr = &reply->Next;

		FString ReplyString;
		FString QuickYes;
		FString QuickNo;
		FString LogString;
		bool closeDialog = false;


		reply->NeedsGold = false;
		while (!sc.CheckToken('}'))
		{
			bool block = false;
			FName key = ParseKey(true, &block);
			if (!block)
			{
				switch(key)
				{
				case NAME_Text:
					ReplyString = CheckString(key);
					break;

				case NAME_Displaycost:
					reply->NeedsGold = CheckBool(key);
					break;

				case NAME_Yesmessage:
					QuickYes = CheckString(key);
					//if (!QuickYes.Compare("_")) QuickYes = "";
					break;

				case NAME_Nomessage:
					QuickNo = CheckString(key);
					break;

				case NAME_Log:
					if (namespace_bits == St)
					{
						const char *s = CheckString(key);
						if(strlen(s) < 4 || strnicmp(s, "LOG", 3) != 0)
						{
							sc.ScriptMessage("Log must be in the format of LOG# to compile, ignoring.");
						}
						else
						{
							reply->LogNumber = atoi(s + 3);
						}
					}
					else
					{
						LogString = CheckString(key);
					}
					break;

				case NAME_Giveitem:
					reply->GiveType = CheckActorType(key);
					break;

				case NAME_Nextpage:
					reply->NextNode = CheckInt(key);
					break;

				case NAME_Closedialog:
					closeDialog = CheckBool(key);
					break;

				case NAME_Special:
					reply->ActionSpecial = CheckInt(key);
					if (reply->ActionSpecial < 0 || reply->ActionSpecial > 255)
						reply->ActionSpecial = 0;
					break;

				case NAME_Arg0:
				case NAME_Arg1:
				case NAME_Arg2:
				case NAME_Arg3:
				case NAME_Arg4:
					reply->Args[int(key)-int(NAME_Arg0)] = CheckInt(key);
					break;


				}
			}
			else
			{
				switch(key)
				{
				case NAME_Cost:
				case NAME_Require:
				case NAME_Exclude:
					// Require and Exclude are exclusive to namespace ZDoom. [FishyClockwork]
					if (key == NAME_Cost || namespace_bits == Zd)
					{
						ParseCostRequireExclude(reply, key);
						break;
					}
					// Intentional fall-through

				default:
					sc.UnGet();
					Skip();
				}
			}
		}
		// Todo: Finalize
		if (reply->ItemCheck.Size() > 0)
		{
			if (reply->ItemCheck[0].Amount <= 0) reply->NeedsGold = false;
		}

		reply->Reply = ncopystring(ReplyString);
		reply->QuickYes = ncopystring(QuickYes);
		if (reply->ItemCheck.Size() > 0 && reply->ItemCheck[0].Item != NULL)
		{
			reply->QuickNo = ncopystring(QuickNo);
		}
		else
		{
			reply->QuickNo = NULL;
		}
		reply->LogString = ncopystring(LogString);
		if(!closeDialog) reply->NextNode *= -1;
		return true;
	}